

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O2

void __thiscall
pstore::repo::generic_section::
generic_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
          (generic_section *this,
          pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
          *d,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
             *i,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
                *x,uint8_t align)

{
  pointer_based_iterator<const_unsigned_char> __first;
  pointer_based_iterator<const_unsigned_char> __last;
  internal_fixup *piVar1;
  external_fixup *peVar2;
  value_type vVar3;
  uint64_t uVar4;
  undefined4 uVar5;
  uint uVar6;
  generic_section *__result;
  internal_fixup *piVar7;
  ulong uVar8;
  external_fixup *peVar9;
  size_t sVar10;
  uint32_t uVar11;
  uint64_t uVar12;
  long lVar13;
  ulong uVar14;
  undefined3 in_register_00000081;
  internal_fixup *__cur;
  
  this->field_0 = (anon_union_4_3_9c849b7e_for_generic_section_1)0x0;
  this->num_xfixups_ = 0;
  this->data_size_ = 0;
  uVar6 = bit_count::ctz((ulong)CONCAT31(in_register_00000081,align));
  (this->field_0).field32_ = uVar6 & 0xff;
  if ((byte)(align ^ align - 1) <= (byte)(align - 1)) {
    assert_failed("bit_count::pop_count (align) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                  ,0x14a);
  }
  __result = this + 1;
  __first.pos_ = (d->first).pos_;
  __last.pos_ = (d->second).pos_;
  if (__first.pos_ != __last.pos_) {
    uVar12 = 0;
    if (0 < (long)__last.pos_ - (long)__first.pos_) {
      uVar12 = (long)__last.pos_ - (long)__first.pos_;
    }
    this->data_size_ = uVar12;
    __result = (generic_section *)
               std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<pstore::pointer_based_iterator<unsigned_char_const>,unsigned_char*>
                         (__first,__last,(uchar *)__result);
  }
  piVar7 = (i->first)._M_current;
  piVar1 = (i->second)._M_current;
  if (piVar7 != piVar1) {
    __result = (generic_section *)((ulong)((long)&__result->num_xfixups_ + 3) & 0xfffffffffffffff8);
    for (; piVar7 != piVar1; piVar7 = piVar7 + 1) {
      uVar5 = *(undefined4 *)((long)&piVar7->addend + 4);
      __result[1].field_0 =
           (anon_union_4_3_9c849b7e_for_generic_section_1)*(undefined4 *)&piVar7->addend;
      __result[1].num_xfixups_ = uVar5;
      vVar3._0_1_ = piVar7->section;
      vVar3._1_1_ = piVar7->type;
      vVar3._2_2_ = piVar7->padding1;
      vVar3._4_4_ = piVar7->padding2;
      uVar12 = piVar7->offset;
      __result->field_0 = (anon_union_4_3_9c849b7e_for_generic_section_1)(int)vVar3;
      __result->num_xfixups_ = (int)(vVar3 >> 0x20);
      __result->data_size_ = uVar12;
      __result = (generic_section *)&__result[1].data_size_;
    }
    lVar13 = (long)(i->second)._M_current - (long)(i->first)._M_current;
    uVar8 = lVar13 / 0x18;
    uVar14 = 0xffffffff;
    if (uVar8 < 0xffffffff) {
      uVar14 = uVar8;
    }
    uVar6 = 0;
    if (0x17 < lVar13) {
      uVar6 = (int)uVar14 << 8;
    }
    (this->field_0).field32_ = uVar6 | *(byte *)&this->field_0;
  }
  peVar9 = (x->first)._M_current;
  peVar2 = (x->second)._M_current;
  if (peVar9 != peVar2) {
    __result = (generic_section *)((ulong)((long)&__result->num_xfixups_ + 3) & 0xfffffffffffffff8);
    for (; peVar9 != peVar2; peVar9 = peVar9 + 1) {
      vVar3 = (peVar9->name).a_.a_;
      uVar12 = *(uint64_t *)&peVar9->type;
      uVar5 = *(undefined4 *)((long)&peVar9->offset + 4);
      uVar4 = peVar9->addend;
      __result[1].field_0 =
           (anon_union_4_3_9c849b7e_for_generic_section_1)*(undefined4 *)&peVar9->offset;
      __result[1].num_xfixups_ = uVar5;
      __result[1].data_size_ = uVar4;
      __result->field_0 = (anon_union_4_3_9c849b7e_for_generic_section_1)(int)vVar3;
      __result->num_xfixups_ = (int)(vVar3 >> 0x20);
      __result->data_size_ = uVar12;
      __result = __result + 2;
    }
    uVar8 = (long)(x->second)._M_current - (long)(x->first)._M_current >> 5;
    uVar14 = 0xffffffff;
    if (uVar8 < 0xffffffff) {
      uVar14 = uVar8;
    }
    uVar11 = (uint32_t)uVar14;
    if ((long)uVar8 < 1) {
      uVar11 = 0;
    }
    this->num_xfixups_ = uVar11;
  }
  if (this <= __result) {
    sVar10 = size_bytes<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
                       (d,i,x);
    if ((long)__result - (long)this == sVar10) {
      return;
    }
  }
  assert_failed("p >= start && static_cast<std::size_t> (p - start) == size_bytes (d, i, x)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                ,0x15d);
}

Assistant:

generic_section::generic_section (DataRange const & d, IFixupRange const & i,
                                          XFixupRange const & x, std::uint8_t const align) {
            align_ = bit_count::ctz (align);
            num_ifixups_ = std::uint32_t{0};

            PSTORE_STATIC_ASSERT (std::is_standard_layout<generic_section>::value);

            PSTORE_STATIC_ASSERT (offsetof (generic_section, field32_) == 0);
            PSTORE_STATIC_ASSERT (offsetof (generic_section, align_) ==
                                  offsetof (generic_section, field32_));
            PSTORE_STATIC_ASSERT (offsetof (generic_section, num_ifixups_) ==
                                  offsetof (generic_section, field32_));

            PSTORE_STATIC_ASSERT (offsetof (generic_section, num_xfixups_) == 4);
            PSTORE_STATIC_ASSERT (offsetof (generic_section, data_size_) == 8);
            PSTORE_STATIC_ASSERT (sizeof (generic_section) == 16);
            PSTORE_STATIC_ASSERT (alignof (generic_section) == 8);
#ifndef NDEBUG
            auto * const start = reinterpret_cast<std::uint8_t const *> (this);
#endif
            // Note that the memory pointed to by 'p' is uninitialized.
            auto * p = reinterpret_cast<std::uint8_t *> (this + 1);
            PSTORE_ASSERT (bit_count::pop_count (align) == 1);

            if (d.first != d.second) {
                data_size_ = generic_section::set_size<decltype (data_size_)> (d.first, d.second);
                p = std::uninitialized_copy (d.first, d.second, p);
            }
            if (i.first != i.second) {
                p = reinterpret_cast<std::uint8_t *> (
                    std::uninitialized_copy (i.first, i.second, aligned_ptr<internal_fixup> (p)));
                num_ifixups_ = generic_section::set_size<decltype (num_ifixups_)::value_type> (
                    i.first, i.second);
            }
            if (x.first != x.second) {
                p = reinterpret_cast<std::uint8_t *> (
                    std::uninitialized_copy (x.first, x.second, aligned_ptr<external_fixup> (p)));
                num_xfixups_ =
                    generic_section::set_size<decltype (num_xfixups_)> (x.first, x.second);
            }
            PSTORE_ASSERT (p >= start &&
                           static_cast<std::size_t> (p - start) == size_bytes (d, i, x));
        }